

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_tessellation.cpp
# Opt level: O0

bool dxil_spv::emit_store_patch_constant_instruction(Impl *impl,CallInst *instruction)

{
  Type *this;
  Builder *this_00;
  CallInst *pCVar1;
  bool bVar2;
  StorageClass storageClass;
  Id IVar3;
  Value *pVVar4;
  Operation *pOVar5;
  LoggingCallback p_Var6;
  void *pvVar7;
  Operation *this_01;
  Operation *cast_op;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Operation *op;
  Operation *min_op;
  BuiltIn local_90;
  Id max_tess_factor_id;
  BuiltIn builtin;
  Id store_value;
  Type *storage_type;
  Operation *add_op_2;
  Operation *pOStack_70;
  Id col_id;
  Operation *add_op_1;
  Operation *add_op;
  Operation *pOStack_58;
  Id row_id;
  Operation *op_1;
  byte local_45;
  uint32_t num_cols;
  Id IStack_40;
  bool row_index;
  Id output_type_id;
  Id ptr_id;
  uint32_t var_id;
  mapped_type *meta;
  Builder *pBStack_28;
  uint32_t output_element_index;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  pBStack_28 = Converter::Impl::builder(impl);
  bVar2 = get_constant_operand((Instruction *)builder,1,(uint32_t *)((long)&meta + 4));
  if (bVar2) {
    _ptr_id = std::
              unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>_>
              ::operator[]((unordered_map<unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ElementPatchMeta>_>_>
                            *)&instruction_local[0x13].super_Instruction.attachments._M_h.
                               _M_rehash_policy,(key_type *)((long)&meta + 4));
    output_type_id = (_ptr_id->super_ElementMeta).id;
    if ((_ptr_id->lowering & 1U) != 0) {
      output_type_id =
           *(Id *)&instruction_local[0xc].super_Instruction.operands.
                   super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    }
    num_cols = spv::Builder::getDerefTypeId(pBStack_28,output_type_id);
    local_45 = 0;
    bVar2 = spv::Builder::isArrayType(pBStack_28,num_cols);
    if (bVar2) {
      local_45 = 1;
      num_cols = spv::Builder::getContainedTypeId(pBStack_28,num_cols);
    }
    op_1._4_4_ = spv::Builder::getNumTypeComponents(pBStack_28,num_cols);
    pCVar1 = instruction_local;
    this_00 = pBStack_28;
    if (((local_45 & 1) == 0) && (op_1._4_4_ < 2)) {
      IStack_40 = output_type_id;
    }
    else {
      storageClass = StorageClassOutput;
      if ((_ptr_id->lowering & 1U) != 0) {
        storageClass = StorageClassPrivate;
      }
      IVar3 = spv::Builder::getScalarTypeId(pBStack_28,num_cols);
      IVar3 = spv::Builder::makePointer(this_00,storageClass,IVar3);
      pOStack_58 = Converter::Impl::allocate((Impl *)pCVar1,OpAccessChain,IVar3);
      IStack_40 = pOStack_58->id;
      Operation::add_id(pOStack_58,output_type_id);
      pCVar1 = instruction_local;
      if ((local_45 & 1) != 0) {
        pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,2);
        add_op._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
        pCVar1 = instruction_local;
        if (((_ptr_id->lowering & 1U) == 0) || (_ptr_id->start_row == 0)) {
          if (((_ptr_id->lowering & 1U) == 0) && ((_ptr_id->super_ElementMeta).semantic_offset != 0)
             ) {
            IVar3 = spv::Builder::makeUintType(pBStack_28,0x20);
            pOStack_70 = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar3);
            Operation::add_id(pOStack_70,add_op._4_4_);
            pOVar5 = pOStack_70;
            IVar3 = spv::Builder::makeUintConstant
                              (pBStack_28,(_ptr_id->super_ElementMeta).semantic_offset,false);
            Operation::add_id(pOVar5,IVar3);
            Converter::Impl::add((Impl *)instruction_local,pOStack_70,false);
            add_op._4_4_ = pOStack_70->id;
          }
        }
        else {
          IVar3 = spv::Builder::makeUintType(pBStack_28,0x20);
          add_op_1 = Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar3);
          Operation::add_id(add_op_1,add_op._4_4_);
          pOVar5 = add_op_1;
          IVar3 = spv::Builder::makeUintConstant(pBStack_28,_ptr_id->start_row,false);
          Operation::add_id(pOVar5,IVar3);
          Converter::Impl::add((Impl *)instruction_local,add_op_1,false);
          add_op._4_4_ = add_op_1->id;
        }
        Operation::add_id(pOStack_58,add_op._4_4_);
      }
      pCVar1 = instruction_local;
      if (1 < op_1._4_4_) {
        pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,3);
        add_op_2._4_4_ = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0x20);
        pCVar1 = instruction_local;
        if (((_ptr_id->lowering & 1U) != 0) && (_ptr_id->start_col != 0)) {
          IVar3 = spv::Builder::makeUintType(pBStack_28,0x20);
          storage_type = (Type *)Converter::Impl::allocate((Impl *)pCVar1,OpIAdd,IVar3);
          Operation::add_id((Operation *)storage_type,add_op_2._4_4_);
          this = storage_type;
          IVar3 = spv::Builder::makeUintConstant(pBStack_28,_ptr_id->start_col,false);
          Operation::add_id((Operation *)this,IVar3);
          Converter::Impl::add((Impl *)instruction_local,(Operation *)storage_type,false);
          add_op_2._4_4_ = *(Id *)((long)&storage_type->context + 4);
        }
        Operation::add_id(pOStack_58,add_op_2._4_4_);
      }
      Converter::Impl::add((Impl *)instruction_local,pOStack_58,false);
    }
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,4);
    _builtin = LLVMBC::Value::getType(pVVar4);
    pCVar1 = instruction_local;
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,4);
    max_tess_factor_id = Converter::Impl::get_id_for_value((Impl *)pCVar1,pVVar4,0);
    pCVar1 = instruction_local;
    pVVar4 = LLVMBC::Instruction::getOperand((Instruction *)builder,4);
    Converter::Impl::register_externally_visible_write((Impl *)pCVar1,pVVar4);
    local_90 = BuiltInPosition;
    if ((((*(int *)((long)&instruction_local[0x19].callee + 4) != 0) &&
         (bVar2 = SPIRVModule::query_builtin_shader_input
                            ((SPIRVModule *)
                             (instruction_local->super_Instruction).super_Value.tween_id,
                             (_ptr_id->super_ElementMeta).id,&local_90), bVar2)) &&
        ((local_90 == BuiltInTessLevelInner || (local_90 == BuiltInTessLevelOuter)))) &&
       ((bVar2 = LLVMBC::Type::isFloatingPointTy(_builtin), bVar2 &&
        (bVar2 = type_is_64bit(_builtin), !bVar2)))) {
      min_op._4_4_ = spv::Builder::makeFloatConstant
                               (pBStack_28,
                                (float)*(uint *)((long)&instruction_local[0x19].callee + 4),false);
      bVar2 = type_is_16bit(_builtin);
      if (bVar2) {
        min_op._4_4_ = Converter::Impl::build_value_cast
                                 ((Impl *)instruction_local,min_op._4_4_,F32,F16,1);
      }
      if ((int)instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count == 0) {
        IVar3 = spv::Builder::import(pBStack_28,"GLSL.std.450");
        *(Id *)&instruction_local[0x16].super_Instruction.attachments._M_h._M_element_count = IVar3;
      }
      pCVar1 = instruction_local;
      IVar3 = Converter::Impl::get_type_id((Impl *)instruction_local,_builtin,0);
      pOVar5 = Converter::Impl::allocate((Impl *)pCVar1,OpExtInst,IVar3);
      Operation::add_id(pOVar5,(Id)instruction_local[0x16].super_Instruction.attachments._M_h.
                                   _M_element_count);
      Operation::add_literal(pOVar5,0x4f);
      Operation::add_id(pOVar5,max_tess_factor_id);
      Operation::add_id(pOVar5,min_op._4_4_);
      Converter::Impl::add((Impl *)instruction_local,pOVar5,false);
      max_tess_factor_id = pOVar5->id;
    }
    pOVar5 = Converter::Impl::allocate((Impl *)instruction_local,OpStore);
    Operation::add_id(pOVar5,IStack_40);
    if ((_ptr_id->lowering & 1U) == 0) {
      max_tess_factor_id =
           Converter::Impl::fixup_store_type_io
                     ((Impl *)instruction_local,(_ptr_id->super_ElementMeta).component_type,1,
                      max_tess_factor_id);
    }
    else {
      bVar2 = type_is_64bit(_builtin);
      if (bVar2) {
        p_Var6 = get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Lowering for dxbc 64-bit patch output not supported.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&cast_op,0x1000,"Lowering for dxbc 64-bit patch output not supported.\n")
          ;
          pvVar7 = get_thread_log_callback_userdata();
          (*p_Var6)(pvVar7,Error,(char *)&cast_op);
        }
        return false;
      }
      bVar2 = LLVMBC::Type::isIntegerTy(_builtin);
      pCVar1 = instruction_local;
      if (!bVar2) {
        IVar3 = spv::Builder::makeUintType(pBStack_28,0x20);
        this_01 = Converter::Impl::allocate((Impl *)pCVar1,OpBitcast,IVar3);
        Operation::add_id(this_01,max_tess_factor_id);
        Converter::Impl::add((Impl *)instruction_local,this_01,false);
        max_tess_factor_id = this_01->id;
      }
    }
    Operation::add_id(pOVar5,max_tess_factor_id);
    Converter::Impl::add((Impl *)instruction_local,pOVar5,false);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_store_patch_constant_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	uint32_t output_element_index;
	if (!get_constant_operand(instruction, 1, &output_element_index))
		return false;

	const auto &meta = impl.patch_elements_meta[output_element_index];
	uint32_t var_id = meta.id;

	if (meta.lowering)
		var_id = impl.execution_mode_meta.patch_lowering_array_var_id;

	spv::Id ptr_id;

	spv::Id output_type_id = builder.getDerefTypeId(var_id);

	bool row_index = false;
	if (builder.isArrayType(output_type_id))
	{
		row_index = true;
		output_type_id = builder.getContainedTypeId(output_type_id);
	}
	uint32_t num_cols = builder.getNumTypeComponents(output_type_id);

	if (row_index || num_cols > 1)
	{
		Operation *op = impl.allocate(
			spv::OpAccessChain, builder.makePointer(
				meta.lowering ? spv::StorageClassPrivate : spv::StorageClassOutput,
				builder.getScalarTypeId(output_type_id)));

		ptr_id = op->id;
		op->add_id(var_id);

		if (row_index)
		{
			spv::Id row_id = impl.get_id_for_value(instruction->getOperand(2));
			if (meta.lowering && meta.start_row != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.start_row));
				impl.add(add_op);

				row_id = add_op->id;
			}
			else if (!meta.lowering && meta.semantic_offset)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(row_id);
				add_op->add_id(builder.makeUintConstant(meta.semantic_offset));
				impl.add(add_op);

				row_id = add_op->id;
			}

			op->add_id(row_id);
		}

		if (num_cols > 1)
		{
			spv::Id col_id = impl.get_id_for_value(instruction->getOperand(3), 32);
			if (meta.lowering && meta.start_col != 0)
			{
				auto *add_op = impl.allocate(spv::OpIAdd, builder.makeUintType(32));
				add_op->add_id(col_id);
				add_op->add_id(builder.makeUintConstant(meta.start_col));
				impl.add(add_op);

				col_id = add_op->id;
			}
			op->add_id(col_id);
		}

		impl.add(op);
	}
	else
		ptr_id = var_id;

	auto *storage_type = instruction->getOperand(4)->getType();

	spv::Id store_value = impl.get_id_for_value(instruction->getOperand(4));
	impl.register_externally_visible_write(instruction->getOperand(4));

	// Tess factors are for some reason classified as inputs
	spv::BuiltIn builtin = { };

	if (impl.options.max_tess_factor &&
	    impl.spirv_module.query_builtin_shader_input(meta.id, &builtin) &&
	    (builtin == spv::BuiltInTessLevelInner || builtin == spv::BuiltInTessLevelOuter) &&
	    storage_type->isFloatingPointTy() && !type_is_64bit(storage_type))
	{
		spv::Id max_tess_factor_id = builder.makeFloatConstant(impl.options.max_tess_factor);

		// Don't bother bit-twiddling this into an fp16 constant manually
		if (type_is_16bit(storage_type))
		{
			max_tess_factor_id = impl.build_value_cast(max_tess_factor_id, DXIL::ComponentType::F32,
			                                           DXIL::ComponentType::F16, 1);
		}

		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		auto *min_op = impl.allocate(spv::OpExtInst, impl.get_type_id(storage_type));
		min_op->add_id(impl.glsl_std450_ext);
		min_op->add_literal(GLSLstd450::GLSLstd450NMin);
		min_op->add_id(store_value);
		min_op->add_id(max_tess_factor_id);
		impl.add(min_op);

		store_value = min_op->id;
	}

	Operation *op = impl.allocate(spv::OpStore);
	op->add_id(ptr_id);

	if (meta.lowering)
	{
		if (type_is_64bit(storage_type))
		{
			LOGE("Lowering for dxbc 64-bit patch output not supported.\n");
			return false;
		}

		if (!storage_type->isIntegerTy())
		{
			auto *cast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
			cast_op->add_id(store_value);
			impl.add(cast_op);
			store_value = cast_op->id;
		}
	}
	else
	{
		store_value = impl.fixup_store_type_io(meta.component_type, 1, store_value);
	}

	op->add_id(store_value);
	impl.add(op);
	return true;
}